

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

string * __thiscall
helics::CoreBroker::generateFederationSummary_abi_cxx11_
          (string *__return_storage_ptr__,CoreBroker *this)

{
  InterfaceType IVar1;
  value_t vVar2;
  _Elt_pointer pBVar3;
  json_value jVar4;
  pointer pBVar5;
  pointer pBVar6;
  string *__return_storage_ptr___00;
  BasicFedInfo *fed;
  reference pvVar7;
  pointer pBVar8;
  pointer pBVar9;
  BasicHandleInfo *hand;
  _Elt_pointer pBVar10;
  int iVar11;
  number_integer_t val;
  int iVar12;
  uint uVar13;
  ulong val_00;
  number_integer_t nVar14;
  _Map_pointer ppBVar15;
  int iVar16;
  int iVar17;
  _Elt_pointer pBVar18;
  number_integer_t val_01;
  number_integer_t val_02;
  ulong val_03;
  json block;
  json summary;
  data local_148;
  data local_138;
  long local_128;
  string *local_120;
  data local_118;
  data local_108;
  data local_f8;
  data local_e8;
  data local_d8;
  data local_c8;
  data local_b8;
  data local_a8;
  data local_98;
  data local_88;
  data local_78;
  data local_68;
  data local_58;
  data local_40;
  
  pBVar10 = (this->handles).handles.
            super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  pBVar3 = (this->handles).handles.
           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  val_03 = 0;
  if (pBVar10 == pBVar3) {
    val_02 = 0;
    val = 0;
    local_128 = 0;
    val_01 = 0;
  }
  else {
    pBVar18 = (this->handles).handles.
              super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
              _M_impl.super__Deque_impl_data._M_start._M_last;
    ppBVar15 = (this->handles).handles.
               super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
    iVar11 = 0;
    iVar16 = 0;
    iVar17 = 0;
    iVar12 = 0;
    do {
      IVar1 = pBVar10->handleType;
      if (IVar1 < PUBLICATION) {
        if (IVar1 == ENDPOINT) {
          iVar11 = iVar11 + 1;
        }
        else if (IVar1 == INPUT) {
          iVar16 = iVar16 + 1;
        }
        else {
LAB_0033ae50:
          iVar17 = iVar17 + 1;
        }
      }
      else if (IVar1 == TRANSLATOR) {
        iVar12 = iVar12 + 1;
      }
      else {
        if (IVar1 != PUBLICATION) goto LAB_0033ae50;
        val_03 = (ulong)((int)val_03 + 1);
      }
      pBVar10 = pBVar10 + 1;
      if (pBVar10 == pBVar18) {
        pBVar10 = ppBVar15[1];
        ppBVar15 = ppBVar15 + 1;
        pBVar18 = pBVar10 + 3;
      }
    } while (pBVar10 != pBVar3);
    val_01 = (number_integer_t)(int)val_03;
    val = (number_integer_t)iVar16;
    val_02 = (number_integer_t)iVar17;
    local_128 = (long)iVar11;
    val_03 = (ulong)iVar12;
  }
  local_138.m_type = null;
  local_138.m_value.object = (object_t *)0x0;
  local_148.m_type = null;
  local_148.m_value.object = (object_t *)0x0;
  local_58.m_type = null;
  local_58._1_7_ = 0;
  local_58.m_value.object = (object_t *)0x0;
  local_120 = __return_storage_ptr__;
  nlohmann::json_abi_v3_11_3::detail::
  external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
  construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_58,
             (long)((int)((ulong)((long)(this->mFederates).dataStorage.
                                        super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->mFederates).dataStorage.
                                       super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                   -0x49249249));
  pvVar7 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)&local_148,"federates");
  vVar2 = (pvVar7->m_data).m_type;
  (pvVar7->m_data).m_type = local_58.m_type;
  local_58.m_type = vVar2;
  jVar4 = (pvVar7->m_data).m_value;
  (pvVar7->m_data).m_value.object = (object_t *)local_58.m_value;
  local_58.m_value = jVar4;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_58);
  local_68.m_type = null;
  local_68._1_7_ = 0;
  local_68.m_value.object = (object_t *)0x0;
  nlohmann::json_abi_v3_11_3::detail::
  external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
  construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_68,(long)(this->super_BrokerBase).minFederateCount);
  pvVar7 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)&local_148,"allowed_federates");
  pvVar7 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::operator[](pvVar7,0);
  vVar2 = (pvVar7->m_data).m_type;
  (pvVar7->m_data).m_type = local_68.m_type;
  local_68.m_type = vVar2;
  jVar4 = (pvVar7->m_data).m_value;
  (pvVar7->m_data).m_value.object = (object_t *)local_68.m_value;
  local_68.m_value = jVar4;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_68);
  local_78.m_type = null;
  local_78._1_7_ = 0;
  local_78.m_value.object = (object_t *)0x0;
  nlohmann::json_abi_v3_11_3::detail::
  external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
  construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_78,(long)(this->super_BrokerBase).maxFederateCount);
  pvVar7 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)&local_148,"allowed_federates");
  pvVar7 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::operator[](pvVar7,1);
  vVar2 = (pvVar7->m_data).m_type;
  (pvVar7->m_data).m_type = local_78.m_type;
  local_78.m_type = vVar2;
  jVar4 = (pvVar7->m_data).m_value;
  (pvVar7->m_data).m_value.object = (object_t *)local_78.m_value;
  local_78.m_value = jVar4;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_78);
  pBVar8 = (this->mFederates).dataStorage.
           super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar5 = (this->mFederates).dataStorage.
           super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  val_00 = 0;
  if (pBVar8 != pBVar5) {
    do {
      uVar13 = (int)val_00 + (pBVar8->nonCounting ^ 1);
      val_00 = (ulong)uVar13;
      pBVar8 = pBVar8 + 1;
    } while (pBVar8 != pBVar5);
    val_00 = (ulong)uVar13;
  }
  local_88.m_type = null;
  local_88._1_7_ = 0;
  local_88.m_value.object = (object_t *)0x0;
  nlohmann::json_abi_v3_11_3::detail::
  external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
  construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_88,val_00);
  pvVar7 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)&local_148,"countable_federates");
  vVar2 = (pvVar7->m_data).m_type;
  (pvVar7->m_data).m_type = local_88.m_type;
  local_88.m_type = vVar2;
  jVar4 = (pvVar7->m_data).m_value;
  (pvVar7->m_data).m_value.object = (object_t *)local_88.m_value;
  local_88.m_value = jVar4;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_88);
  pBVar9 = (this->mBrokers).dataStorage.
           super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pBVar6 = (this->mBrokers).dataStorage.
           super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pBVar9 == pBVar6) {
    nVar14 = 0;
  }
  else {
    iVar11 = 0;
    do {
      iVar11 = iVar11 + (pBVar9->_core ^ 1);
      pBVar9 = pBVar9 + 1;
    } while (pBVar9 != pBVar6);
    nVar14 = (number_integer_t)iVar11;
  }
  local_98.m_type = null;
  local_98._1_7_ = 0;
  local_98.m_value.object = (object_t *)0x0;
  nlohmann::json_abi_v3_11_3::detail::
  external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
  construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_98,nVar14);
  pvVar7 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)&local_148,"brokers");
  vVar2 = (pvVar7->m_data).m_type;
  (pvVar7->m_data).m_type = local_98.m_type;
  local_98.m_type = vVar2;
  jVar4 = (pvVar7->m_data).m_value;
  (pvVar7->m_data).m_value.object = (object_t *)local_98.m_value;
  local_98.m_value = jVar4;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_98);
  pBVar9 = (this->mBrokers).dataStorage.
           super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pBVar6 = (this->mBrokers).dataStorage.
           super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pBVar9 == pBVar6) {
    nVar14 = 0;
  }
  else {
    iVar11 = 0;
    do {
      iVar11 = iVar11 + (uint)pBVar9->_core;
      pBVar9 = pBVar9 + 1;
    } while (pBVar9 != pBVar6);
    nVar14 = (number_integer_t)iVar11;
  }
  local_a8.m_type = null;
  local_a8._1_7_ = 0;
  local_a8.m_value.object = (object_t *)0x0;
  nlohmann::json_abi_v3_11_3::detail::
  external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
  construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_a8,nVar14);
  pvVar7 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)&local_148,"cores");
  vVar2 = (pvVar7->m_data).m_type;
  (pvVar7->m_data).m_type = local_a8.m_type;
  local_a8.m_type = vVar2;
  jVar4 = (pvVar7->m_data).m_value;
  (pvVar7->m_data).m_value.object = (object_t *)local_a8.m_value;
  local_a8.m_value = jVar4;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_a8);
  local_b8.m_type = null;
  local_b8._1_7_ = 0;
  local_b8.m_value.object = (object_t *)0x0;
  nlohmann::json_abi_v3_11_3::detail::
  external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
  construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_b8,(long)(this->super_BrokerBase).minBrokerCount);
  pvVar7 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)&local_148,"allowed_brokers");
  pvVar7 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::operator[](pvVar7,0);
  vVar2 = (pvVar7->m_data).m_type;
  (pvVar7->m_data).m_type = local_b8.m_type;
  local_b8.m_type = vVar2;
  jVar4 = (pvVar7->m_data).m_value;
  (pvVar7->m_data).m_value.object = (object_t *)local_b8.m_value;
  local_b8.m_value = jVar4;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_b8);
  local_c8.m_type = null;
  local_c8._1_7_ = 0;
  local_c8.m_value.object = (object_t *)0x0;
  nlohmann::json_abi_v3_11_3::detail::
  external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
  construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_c8,(long)(this->super_BrokerBase).maxBrokerCount);
  pvVar7 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)&local_148,"allowed_brokers");
  pvVar7 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
           ::operator[](pvVar7,1);
  vVar2 = (pvVar7->m_data).m_type;
  (pvVar7->m_data).m_type = local_c8.m_type;
  local_c8.m_type = vVar2;
  jVar4 = (pvVar7->m_data).m_value;
  (pvVar7->m_data).m_value.object = (object_t *)local_c8.m_value;
  local_c8.m_value = jVar4;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_c8);
  local_d8.m_type = null;
  local_d8._1_7_ = 0;
  local_d8.m_value.object = (object_t *)0x0;
  nlohmann::json_abi_v3_11_3::detail::
  external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
  construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_d8,val_01);
  pvVar7 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)&local_148,"publications");
  vVar2 = (pvVar7->m_data).m_type;
  (pvVar7->m_data).m_type = local_d8.m_type;
  local_d8.m_type = vVar2;
  jVar4 = (pvVar7->m_data).m_value;
  (pvVar7->m_data).m_value.object = (object_t *)local_d8.m_value;
  local_d8.m_value = jVar4;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_d8);
  local_e8.m_type = null;
  local_e8._1_7_ = 0;
  local_e8.m_value.object = (object_t *)0x0;
  nlohmann::json_abi_v3_11_3::detail::
  external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
  construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_e8,val);
  pvVar7 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)&local_148,"inputs");
  vVar2 = (pvVar7->m_data).m_type;
  (pvVar7->m_data).m_type = local_e8.m_type;
  local_e8.m_type = vVar2;
  jVar4 = (pvVar7->m_data).m_value;
  (pvVar7->m_data).m_value.object = (object_t *)local_e8.m_value;
  local_e8.m_value = jVar4;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_e8);
  local_f8.m_type = null;
  local_f8._1_7_ = 0;
  local_f8.m_value.object = (object_t *)0x0;
  nlohmann::json_abi_v3_11_3::detail::
  external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
  construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_f8,val_02);
  pvVar7 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)&local_148,"filters");
  vVar2 = (pvVar7->m_data).m_type;
  (pvVar7->m_data).m_type = local_f8.m_type;
  local_f8.m_type = vVar2;
  jVar4 = (pvVar7->m_data).m_value;
  (pvVar7->m_data).m_value.object = (object_t *)local_f8.m_value;
  local_f8.m_value = jVar4;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_f8);
  local_108.m_type = null;
  local_108._1_7_ = 0;
  local_108.m_value.object = (object_t *)0x0;
  nlohmann::json_abi_v3_11_3::detail::
  external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
  construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_108,local_128);
  pvVar7 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)&local_148,"endpoints");
  vVar2 = (pvVar7->m_data).m_type;
  (pvVar7->m_data).m_type = local_108.m_type;
  local_108.m_type = vVar2;
  jVar4 = (pvVar7->m_data).m_value;
  (pvVar7->m_data).m_value.object = (object_t *)local_108.m_value;
  local_108.m_value = jVar4;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_108);
  local_118.m_type = null;
  local_118._1_7_ = 0;
  local_118.m_value.object = (object_t *)0x0;
  nlohmann::json_abi_v3_11_3::detail::
  external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
  construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
              *)&local_118,val_03);
  pvVar7 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)&local_148,"translators");
  vVar2 = (pvVar7->m_data).m_type;
  (pvVar7->m_data).m_type = local_118.m_type;
  local_118.m_type = vVar2;
  jVar4 = (pvVar7->m_data).m_value;
  (pvVar7->m_data).m_value.object = (object_t *)local_118.m_value;
  local_118.m_value = jVar4;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_118);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_40,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_148);
  __return_storage_ptr___00 = local_120;
  pvVar7 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)&local_138,"summary");
  vVar2 = (pvVar7->m_data).m_type;
  (pvVar7->m_data).m_type = local_40.m_type;
  jVar4 = (pvVar7->m_data).m_value;
  (pvVar7->m_data).m_value = local_40.m_value;
  local_40.m_type = vVar2;
  local_40.m_value = jVar4;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_40);
  BrokerBase::addBaseInformation
            (&this->super_BrokerBase,(json *)&local_138,(bool)(this->super_BrokerBase).field_0x294);
  fileops::generateJsonString((string *)__return_storage_ptr___00,(json *)&local_138,true);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_148);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_138);
  return __return_storage_ptr___00;
}

Assistant:

std::string CoreBroker::generateFederationSummary() const
{
    int pubs = 0;
    int epts = 0;
    int ipts = 0;
    int filt = 0;
    int translators = 0;
    for (const auto& hand : handles) {
        switch (hand.handleType) {
            case InterfaceType::PUBLICATION:
                ++pubs;
                break;
            case InterfaceType::INPUT:
                ++ipts;
                break;
            case InterfaceType::ENDPOINT:
                ++epts;
                break;
            case InterfaceType::TRANSLATOR:
                ++translators;
                break;
            default:
                ++filt;
                break;
        }
    }
    nlohmann::json summary;
    nlohmann::json block;
    block["federates"] = static_cast<int>(mFederates.size());
    block["allowed_federates"][0] = minFederateCount;
    block["allowed_federates"][1] = maxFederateCount;
    block["countable_federates"] = getCountableFederates();
    block["brokers"] =
        static_cast<int>(std::count_if(mBrokers.begin(), mBrokers.end(), [](auto& brk) {
            return !static_cast<bool>(brk._core);
        }));
    block["cores"] =
        static_cast<int>(std::count_if(mBrokers.begin(), mBrokers.end(), [](auto& brk) {
            return static_cast<bool>(brk._core);
        }));
    block["allowed_brokers"][0] = minBrokerCount;
    block["allowed_brokers"][1] = maxBrokerCount;
    block["publications"] = pubs;
    block["inputs"] = ipts;
    block["filters"] = filt;
    block["endpoints"] = epts;
    block["translators"] = translators;
    summary["summary"] = block;
    addBaseInformation(summary, isRootc);
    return fileops::generateJsonString(summary);
}